

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddUnaryOp
          (InstructionBuilder *this,uint32_t type_id,Op opcode,uint32_t operand1)

{
  IRContext *c;
  uint32_t res_id;
  Instruction *pIVar1;
  initializer_list<unsigned_int> init_list;
  uint32_t local_ac;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_a8;
  undefined4 local_a0 [2];
  SmallVector<unsigned_int,_2UL> local_98;
  SmallVector<unsigned_int,_2UL> local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (type_id == 0) {
    res_id = 0;
  }
  else {
    res_id = IRContext::TakeNextId(this->context_);
    if (res_id == 0) {
      return (Instruction *)0x0;
    }
  }
  pIVar1 = (Instruction *)operator_new(0x70);
  c = this->context_;
  init_list._M_len = 1;
  init_list._M_array = &local_ac;
  local_ac = operand1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list);
  local_a0[0] = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,&local_70);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             local_a0,&local_70);
  Instruction::Instruction(pIVar1,c,opcode,type_id,res_id,(OperandList *)&local_48);
  local_a8._M_head_impl = pIVar1;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
  pIVar1 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_a8);
  if (local_a8._M_head_impl != (Instruction *)0x0) {
    (*((local_a8._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return pIVar1;
}

Assistant:

Instruction* AddUnaryOp(uint32_t type_id, spv::Op opcode, uint32_t operand1) {
    uint32_t result_id = 0;
    if (type_id != 0) {
      result_id = GetContext()->TakeNextId();
      if (result_id == 0) {
        return nullptr;
      }
    }
    std::unique_ptr<Instruction> newUnOp(new Instruction(
        GetContext(), opcode, type_id, result_id,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand1}}}));
    return AddInstruction(std::move(newUnOp));
  }